

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLibCore.cpp
# Opt level: O0

Variant * Jinx::Impl::GetSize(Variant *__return_storage_ptr__,ScriptPtr *param_1,Parameters *params)

{
  ValueType VVar1;
  const_reference pvVar2;
  element_type *this;
  size_type value;
  element_type *this_00;
  size_t sVar3;
  undefined1 local_70 [64];
  undefined1 local_30 [24];
  Parameters *params_local;
  ScriptPtr *param_0_local;
  
  local_30._16_8_ = params;
  params_local = (Parameters *)param_1;
  param_0_local = (ScriptPtr *)__return_storage_ptr__;
  pvVar2 = std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::operator[](params,0);
  VVar1 = Variant::GetType(pvVar2);
  if (VVar1 == String) {
    pvVar2 = std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::operator[]
                       ((vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_> *)local_30._16_8_,0)
    ;
    Variant::GetString_abi_cxx11_((String *)(local_70 + 0x10),pvVar2);
    sVar3 = GetStringCount((String *)(local_70 + 0x10));
    Variant::Variant(__return_storage_ptr__,sVar3);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
              ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
               (local_70 + 0x10));
  }
  else if (VVar1 == Collection) {
    std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::operator[]
              ((vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_> *)local_30._16_8_,0);
    Variant::GetCollection((Variant *)local_30);
    this = std::
           __shared_ptr_access<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_30);
    value = std::
            map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>
            ::size(this);
    Variant::Variant(__return_storage_ptr__,value);
    std::
    shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>
    ::~shared_ptr((shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>
                   *)local_30);
  }
  else if (VVar1 == Buffer) {
    std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::operator[]
              ((vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_> *)local_30._16_8_,0);
    Variant::GetBuffer((Variant *)local_70);
    this_00 = std::__shared_ptr_access<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_70);
    sVar3 = Buffer::Size(this_00);
    Variant::Variant(__return_storage_ptr__,sVar3);
    std::shared_ptr<Jinx::Buffer>::~shared_ptr((shared_ptr<Jinx::Buffer> *)local_70);
  }
  else {
    Variant::Variant(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

inline_t Variant GetSize(ScriptPtr, const Parameters & params)
	{
		switch (params[0].GetType())
		{
		case ValueType::Collection:
			return static_cast<int64_t>(params[0].GetCollection()->size());
		case ValueType::String:
			return static_cast<int64_t>(GetStringCount(params[0].GetString()));
		case ValueType::Buffer:
			return static_cast<int64_t>(params[0].GetBuffer()->Size());
		default:
			break;
		}
		return nullptr;
	}